

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value,basic_format_specs<char> *specs)

{
  buffer_appender<char> bVar1;
  basic_format_specs<char> *in_RDX;
  undefined1 in_SIL;
  size_t in_RDI;
  undefined7 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._7_1_ = in_SIL;
  bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_7_ =
       in_stack_ffffffffffffffe8;
  bVar1 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_specs<char>const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    (bVar1,in_RDX,in_RDI,
                     (anon_class_1_1_a8c68091 *)CONCAT17(in_SIL,in_stack_ffffffffffffffd0));
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_char(OutputIt out, Char value,
                    const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, 1, [=](iterator it) {
    *it++ = value;
    return it;
  });
}